

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TaggedPatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TaggedPatternSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::PatternSyntax*&>
          (BumpAllocator *this,Token *args,Token *args_1,PatternSyntax **args_2)

{
  Token memberName;
  Token tagged;
  TaggedPatternSyntax *pattern;
  Info *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pattern = (TaggedPatternSyntax *)
            allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  tagged.info = in_RCX;
  tagged._0_8_ = in_RSI[1];
  memberName.info = (Info *)*in_RSI;
  memberName._0_8_ = in_RDX[1];
  slang::syntax::TaggedPatternSyntax::TaggedPatternSyntax
            ((TaggedPatternSyntax *)*in_RDX,tagged,memberName,(PatternSyntax *)pattern);
  return pattern;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }